

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderIsEmptyElement(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local._4_4_ = 0xffffffff;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    if (reader->curnode == (xmlNodePtr)0x0) {
      if (reader->node->children == (_xmlNode *)0x0) {
        if (reader->state == XML_TEXTREADER_END) {
          reader_local._4_4_ = 0;
        }
        else if (reader->doc == (xmlDocPtr)0x0) {
          if (reader->in_xinclude < 1) {
            reader_local._4_4_ = (uint)((reader->node->extra & 1) != 0);
          }
          else {
            reader_local._4_4_ = 1;
          }
        }
        else {
          reader_local._4_4_ = 1;
        }
      }
      else {
        reader_local._4_4_ = 0;
      }
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderIsEmptyElement(xmlTextReaderPtr reader) {
    if ((reader == NULL) || (reader->node == NULL))
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode != NULL)
	return(0);
    if (reader->node->children != NULL)
	return(0);
    if (reader->state == XML_TEXTREADER_END)
	return(0);
    if (reader->doc != NULL)
        return(1);
#ifdef LIBXML_XINCLUDE_ENABLED
    if (reader->in_xinclude > 0)
        return(1);
#endif
    return((reader->node->extra & NODE_IS_EMPTY) != 0);
}